

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  _func_int **pp_Var1;
  string *this_00;
  NonCopyable NVar2;
  int iVar3;
  undefined8 *puVar4;
  pointer puVar5;
  NamePattern *this_01;
  Pattern *p;
  pointer puVar6;
  pointer pcVar7;
  ulong uVar8;
  bool bVar9;
  Ptr<Catch::TestSpec::Pattern> pattern;
  string token;
  NonCopyable local_b0;
  ulong local_a8;
  undefined1 local_a0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  pointer *local_50;
  long local_48;
  pointer local_40 [2];
  
  std::__cxx11::string::substr((ulong)(local_a0 + 0x30),(ulong)&this->m_arg);
  puVar5 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar5) {
    this_00 = (string *)(local_a0 + 0x30);
    uVar8 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
      std::__cxx11::string::substr((ulong)(local_a0 + 0x10),(ulong)this_00);
      pcVar7 = (pointer)0xf;
      if (local_50 != local_40) {
        pcVar7 = local_40[0];
      }
      if (pcVar7 < (pointer)(local_a0._24_8_ + local_48)) {
        pcVar7 = (pointer)0xf;
        if ((undefined1 *)local_a0._16_8_ != local_a0 + 0x20) {
          pcVar7 = (pointer)local_a0._32_8_;
        }
        if (pcVar7 < (pointer)(local_a0._24_8_ + local_48)) goto LAB_001260a7;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)(local_a0 + 0x10),0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_001260a7:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,local_a0._16_8_);
      }
      pp_Var1 = (_func_int **)(puVar4 + 2);
      if ((_func_int **)*puVar4 == pp_Var1) {
        local_a0._0_8_ = *pp_Var1;
        local_a0._8_8_ = puVar4[3];
        local_b0._vptr_NonCopyable = (_func_int **)local_a0;
      }
      else {
        local_a0._0_8_ = *pp_Var1;
        local_b0._vptr_NonCopyable = (_func_int **)*puVar4;
      }
      local_a8 = puVar4[1];
      *puVar4 = pp_Var1;
      puVar4[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::operator=(this_00,(string *)&local_b0);
      if (local_b0._vptr_NonCopyable != (_func_int **)local_a0) {
        operator_delete(local_b0._vptr_NonCopyable);
      }
      if ((undefined1 *)local_a0._16_8_ != local_a0 + 0x20) {
        operator_delete((void *)local_a0._16_8_);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar8 = uVar8 + 1;
      puVar5 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar8 < (ulong)((long)puVar6 - (long)puVar5 >> 3));
  }
  if (puVar6 != puVar5) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  local_b0._vptr_NonCopyable = (_func_int **)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"exclude:","");
  NVar2._vptr_NonCopyable = local_b0._vptr_NonCopyable;
  if ((ulong)local_70._8_8_ < local_a8) {
    bVar9 = false;
  }
  else if (local_a8 == 0) {
    bVar9 = true;
  }
  else {
    iVar3 = bcmp(local_b0._vptr_NonCopyable,(void *)local_70._M_allocated_capacity,local_a8);
    bVar9 = iVar3 == 0;
  }
  if ((NamePattern *)NVar2._vptr_NonCopyable != (NamePattern *)local_a0) {
    operator_delete(NVar2._vptr_NonCopyable);
  }
  if (bVar9) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)(local_a0 + 0x30));
    std::__cxx11::string::operator=((string *)(local_a0 + 0x30),(string *)&local_b0);
    if ((NamePattern *)local_b0._vptr_NonCopyable != (NamePattern *)local_a0) {
      operator_delete(local_b0._vptr_NonCopyable);
    }
  }
  if (local_70._8_8_ != 0) {
    this_01 = (NamePattern *)operator_new(0x40);
    TestSpec::NamePattern::NamePattern(this_01,(string *)(local_a0 + 0x30));
    local_b0._vptr_NonCopyable = (_func_int **)this_01;
    (**(code **)(*(long *)&(this_01->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared +
                0x10))(this_01);
    if (this->m_exclusion == true) {
      p = (Pattern *)operator_new(0x18);
      (p->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ExcludedPattern_00161b08;
      p[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)this_01;
      (**(code **)(*(long *)&(this_01->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared
                  + 0x10))(this_01);
      Ptr<Catch::TestSpec::Pattern>::operator=((Ptr<Catch::TestSpec::Pattern> *)&local_b0,p);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)&local_b0);
    if ((NamePattern *)local_b0._vptr_NonCopyable != (NamePattern *)0x0) {
      (**(code **)(*local_b0._vptr_NonCopyable + 0x18))();
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if ((undefined1 *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }